

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

ON_PlaneSurface * __thiscall ON_PlaneSurface::operator=(ON_PlaneSurface *this,ON_PlaneSurface *src)

{
  undefined8 uVar1;
  long lVar2;
  ON_Plane *pOVar3;
  ON_Plane *pOVar4;
  byte bVar5;
  
  bVar5 = 0;
  if (this != src) {
    ON_Surface::operator=(&this->super_ON_Surface,&src->super_ON_Surface);
    pOVar3 = &src->m_plane;
    pOVar4 = &this->m_plane;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar4->origin).x = (pOVar3->origin).x;
      pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar5 * -0x10 + 8);
      pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    uVar1 = *(undefined8 *)&src->field_0x98;
    *(undefined8 *)&this->field_0x90 = *(undefined8 *)&src->field_0x90;
    *(undefined8 *)&this->field_0x98 = uVar1;
    uVar1 = *(undefined8 *)&src->field_0xa8;
    *(undefined8 *)&this->field_0xa0 = *(undefined8 *)&src->field_0xa0;
    *(undefined8 *)&this->field_0xa8 = uVar1;
    uVar1 = *(undefined8 *)&src->field_0xb8;
    *(undefined8 *)&this->field_0xb0 = *(undefined8 *)&src->field_0xb0;
    *(undefined8 *)&this->field_0xb8 = uVar1;
    uVar1 = *(undefined8 *)&src->field_0xc8;
    *(undefined8 *)&this->field_0xc0 = *(undefined8 *)&src->field_0xc0;
    *(undefined8 *)&this->field_0xc8 = uVar1;
  }
  return this;
}

Assistant:

ON_PlaneSurface& ON_PlaneSurface::operator=( const ON_PlaneSurface& src )
{
  if ( this != &src ) {
    ON_Surface::operator=(src);
    m_plane = src.m_plane;
    m_domain[0] = src.m_domain[0];
    m_domain[1] = src.m_domain[1];
    m_extents[0] = src.m_extents[0];
    m_extents[1] = src.m_extents[1];
  }
  return *this;
}